

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O0

void encoderEngine(Territory ccode,EncodeRec *enc,int stop_with_one_result,int extraDigits,
                  int requiredEncoder,Territory ccode_override)

{
  char headerLetter;
  Mapcodes *pMVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Territory ccode_00;
  char (*territoryISO) [29];
  Territory local_d8;
  char *s;
  Territory ccodeFinal;
  char local_b8 [3];
  char headerletter;
  int result_counter;
  char result [128];
  int i;
  int upto;
  int from;
  Territory ccode_override_local;
  int requiredEncoder_local;
  int extraDigits_local;
  int stop_with_one_result_local;
  EncodeRec *enc_local;
  Territory ccode_local;
  
  if ((enc != (EncodeRec *)0x0) && (999 < ccode)) {
    iVar2 = firstRec(ccode);
    iVar3 = lastRec(ccode);
    iVar4 = fitsInsideBoundaries(&enc->coord32,TERRITORY_BOUNDARIES + iVar3);
    if (iVar4 != 0) {
      ccodeFinal = TERRITORY_UNKNOWN;
      local_b8[0] = '\0';
      for (result._124_4_ = iVar2; (int)result._124_4_ <= iVar3; result._124_4_ = result._124_4_ + 1
          ) {
        iVar2 = fitsInsideBoundaries(&enc->coord32,TERRITORY_BOUNDARIES + (int)result._124_4_);
        if (iVar2 != 0) {
          if ((TERRITORY_BOUNDARIES[(int)result._124_4_].flags & 0x40U) == 0) {
            if ((TERRITORY_BOUNDARIES[(int)result._124_4_].flags >> 7 & 3U) < 2) {
              if ((result._124_4_ == iVar3) && (iVar2 = isSubdivision(ccode), iVar2 != 0)) {
                ccode_00 = parentTerritoryOf(ccode);
                encoderEngine(ccode_00,enc,stop_with_one_result,extraDigits,requiredEncoder,ccode);
                return;
              }
              if (((ccodeFinal != TERRITORY_UNKNOWN) ||
                  ((TERRITORY_BOUNDARIES[(int)result._124_4_].flags & 0x200U) == 0)) &&
                 (iVar2 = coDex(result._124_4_), iVar2 < 0x36)) {
                if ((TERRITORY_BOUNDARIES[(int)result._124_4_].flags >> 7 & 3U) == 1) {
                  headerLetter = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"
                                 [(int)(TERRITORY_BOUNDARIES[(int)result._124_4_].flags >> 0xb &
                                       0x1f)];
                }
                else {
                  headerLetter = '\0';
                }
                encodeGrid(local_b8,enc,result._124_4_,extraDigits,headerLetter);
              }
            }
            else {
              encodeAutoHeader(local_b8,enc,result._124_4_,extraDigits);
            }
          }
          else {
            encodeNameless(local_b8,enc,ccode,extraDigits,result._124_4_);
          }
          if (local_b8[0] != '\0') {
            ccodeFinal = ccodeFinal + 1;
            repackIfAllDigits(local_b8,0);
            if ((requiredEncoder < 0) || (requiredEncoder == result._124_4_)) {
              local_d8 = ccode;
              if (ccode_override != TERRITORY_NONE) {
                local_d8 = ccode_override;
              }
              if (((local_b8[0] != '\0') && (enc->mapcodes != (Mapcodes *)0x0)) &&
                 (enc->mapcodes->count < 0x16)) {
                pMVar1 = enc->mapcodes;
                iVar2 = enc->mapcodes->count;
                enc->mapcodes->count = iVar2 + 1;
                territoryISO = pMVar1->mapcode + iVar2;
                if (local_d8 == TERRITORY_AAA) {
                  strcpy(*territoryISO,local_b8);
                }
                else {
                  getTerritoryIsoName(*territoryISO,local_d8,0);
                  strcat(*territoryISO,anon_var_dwarf_baa6 + 0x16);
                  strcat(*territoryISO,local_b8);
                }
              }
              if (requiredEncoder == result._124_4_) {
                return;
              }
            }
            if (stop_with_one_result != 0) {
              return;
            }
            local_b8[0] = '\0';
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void encoderEngine(const enum Territory ccode, const EncodeRec *enc, const int stop_with_one_result,
                          const int extraDigits, const int requiredEncoder, const enum Territory ccode_override) {
    int from;
    int upto;
    ASSERT(enc);
    ASSERT((0 <= extraDigits) && (extraDigits <= MAX_PRECISION_DIGITS));

    if (!enc || (ccode < _TERRITORY_MIN)) {
        return;
    } // bad arguments

    from = firstRec(ccode);
    upto = lastRec(ccode);

    if (!fitsInsideBoundaries(&enc->coord32, TERRITORY_BOUNDARY(upto))) {
        return;
    }

    ///////////////////////////////////////////////////////////
    // look for encoding options
    ///////////////////////////////////////////////////////////
    {
        int i;
        char result[128];
        int result_counter = 0;

        *result = 0;
        for (i = from; i <= upto; i++) {
            if (fitsInsideBoundaries(&enc->coord32, TERRITORY_BOUNDARY(i))) {
                if (IS_NAMELESS(i)) {
                    encodeNameless(result, enc, ccode, extraDigits, i);
                } else if (REC_TYPE(i) > 1) {
                    encodeAutoHeader(result, enc, i, extraDigits);
                } else if ((i == upto) && isSubdivision(ccode)) {
                    // *** do a recursive call for the parent ***
                    encoderEngine(parentTerritoryOf(ccode), enc, stop_with_one_result, extraDigits, requiredEncoder,
                                  ccode);
                    return;
                } else // must be grid
                {
                    // skip IS_RESTRICTED records unless there already is a result
                    if (result_counter || !IS_RESTRICTED(i)) {
                        if (coDex(i) < 54) {
                            char headerletter = (char) ((REC_TYPE(i) == 1) ? HEADER_LETTER(i) : 0);
                            encodeGrid(result, enc, i, extraDigits, headerletter);
                        }
                    }
                }

                // =========== handle result (if any)
                if (*result) {
                    result_counter++;

                    repackIfAllDigits(result, 0);

                    if ((requiredEncoder < 0) || (requiredEncoder == i)) {
                        const enum Territory ccodeFinal = (ccode_override != TERRITORY_NONE ? ccode_override : ccode);
                        if (*result && enc->mapcodes && (enc->mapcodes->count < MAX_NR_OF_MAPCODE_RESULTS)) {
                            char *s = enc->mapcodes->mapcode[enc->mapcodes->count++];
                            if (ccodeFinal == TERRITORY_AAA) { // AAA is never shown with territory
                                strcpy(s, result);
                            } else {
                                getTerritoryIsoName(s, ccodeFinal, 0);
                                strcat(s, " ");
                                strcat(s, result);
                            }
                        }
                        if (requiredEncoder == i) {
                            return;
                        }
                    }
                    if (stop_with_one_result) {
                        return;
                    }
                    *result = 0; // clear for next iteration
                }
            }
        } // for i
    }
}